

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetDataPdu.cpp
# Opt level: O0

int __thiscall DIS::SetDataPdu::getMarshalledSize(SetDataPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 local_78 [8];
  VariableDatum listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  FixedDatum listElement;
  unsigned_long_long idx;
  int marshalSize;
  SetDataPdu *this_local;
  
  iVar2 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  idx._4_4_ = iVar2 + 0x10;
  listElement._fixedDatumID = 0;
  listElement._fixedDatumValue = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar4 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatums);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatums,listElement._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar5);
    iVar2 = FixedDatum::getMarshalledSize((FixedDatum *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._arrayLength = 0;
  listElement_1._44_4_ = 0;
  while( true ) {
    uVar1 = listElement_1._40_8_;
    sVar4 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatums);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatums,listElement_1._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar6);
    uVar3 = VariableDatum::getMarshalledSize((VariableDatum *)local_78);
    idx._4_4_ = idx._4_4_ + uVar3;
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    listElement_1._40_8_ = listElement_1._40_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int SetDataPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _padding1
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatums.size(); idx++)
   {
        FixedDatum listElement = _fixedDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatums.size(); idx++)
   {
        VariableDatum listElement = _variableDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}